

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnSelectExpr(BinaryReaderIR *this,Type result_type)

{
  Result RVar1;
  Expr *local_40;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_30;
  
  local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = result_type.enum_;
  local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((wabt *)&local_40,&local_30);
  local_38._M_head_impl = local_40;
  local_40 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_40 != (Expr *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  local_40 = (Expr *)0x0;
  if (local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Type result_type) {
  return AppendExpr(MakeUnique<SelectExpr>(TypeVector{result_type}));
}